

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O1

void c140_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint *puVar1;
  byte bVar2;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  long lVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ushort uVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  
  __s = *outputs;
  __s_00 = outputs[1];
  uVar8 = (ulong)samples;
  memset(__s,0,uVar8 * 4);
  memset(__s_00,0,uVar8 * 4);
  lVar3 = *(long *)((long)param + 0x20);
  if (lVar3 == 0) {
    return;
  }
  lVar5 = 0;
LAB_00166c68:
  if ((*(char *)((long)param + lVar5 * 0x24 + 0x448) != '\0') &&
     (puVar1 = (uint *)((long)param + lVar5 * 0x24 + 0x428), *(char *)((long)puVar1 + 0x21) == '\0')
     ) {
    lVar9 = lVar5 * 0x10;
    uVar10 = *(ushort *)((long)param + lVar9 + 0x2a);
    uVar10 = uVar10 << 8 | uVar10 >> 8;
    if (uVar10 != 0) {
      uVar12 = (uint)*(byte *)((long)param + lVar9 + 0x2c) * 0x10000 + puVar1[5];
      if (*(char *)((long)param + 0x14) == '\x01') {
        uVar4 = uVar12 >> 1 & 0x180000;
LAB_00166ce7:
        uVar4 = uVar12 & 0x7ffff | uVar4;
      }
      else {
        uVar4 = 0;
        if (*(char *)((long)param + 0x14) == '\0') {
          uVar4 = uVar12 >> 2 & 0x80000;
          goto LAB_00166ce7;
        }
      }
      iVar11 = (int)((float)uVar10 * *(float *)((long)param + 0x10));
      iVar13 = puVar1[6] - puVar1[5];
      lVar14 = (ulong)uVar4 + lVar3;
      bVar2 = *(byte *)((long)param + lVar9 + 0x2d);
      if ((bVar2 & 8) == 0) {
        if (samples != 0) {
          uVar15 = 0;
          do {
            uVar12 = *puVar1 + iVar11;
            uVar6 = uVar12 & 0xffff;
            uVar12 = uVar12 >> 0x10 & 0x7fff;
            *puVar1 = uVar6;
            uVar4 = puVar1[1] + uVar12;
            puVar1[1] = uVar4;
            if (iVar13 <= (int)uVar4) {
              if ((bVar2 & 0x10) == 0) goto LAB_00166e51;
              puVar1[1] = puVar1[7] - puVar1[5];
            }
            if (uVar12 != 0) {
              uVar12 = puVar1[2];
              puVar1[3] = uVar12;
              uVar4 = *(char *)(lVar14 + (int)puVar1[1]) * 0x100;
              puVar1[2] = uVar4;
              puVar1[4] = uVar4 - uVar12;
            }
            iVar7 = ((int)(uVar6 * puVar1[4]) >> 0x10) + puVar1[3];
            __s[uVar15] = __s[uVar15] +
                          ((int)((uint)*(byte *)((long)param + lVar9 + 0x29) * iVar7) >> 8);
            __s_00[uVar15] =
                 __s_00[uVar15] + ((int)((uint)*(byte *)((long)param + lVar9 + 0x28) * iVar7) >> 8);
            uVar15 = uVar15 + 1;
          } while (uVar8 != uVar15);
        }
      }
      else if (samples != 0) {
        uVar15 = 0;
        do {
          uVar12 = *puVar1 + iVar11;
          uVar4 = uVar12 & 0xffff;
          *puVar1 = uVar4;
          uVar12 = (uVar12 >> 0x10 & 0x7fff) + puVar1[1];
          puVar1[1] = uVar12;
          if (iVar13 <= (int)uVar12) {
            if ((bVar2 & 0x10) == 0) goto LAB_00166e51;
            puVar1[1] = puVar1[7] - puVar1[5];
          }
          uVar12 = puVar1[2];
          puVar1[3] = uVar12;
          uVar6 = (uint)*(short *)((long)param +
                                  (ulong)*(byte *)(lVar14 + (int)puVar1[1]) * 2 + 0x228);
          puVar1[2] = uVar6;
          uVar6 = uVar6 - uVar12;
          puVar1[4] = uVar6;
          iVar7 = ((int)(uVar6 * uVar4) >> 0x10) + uVar12;
          __s[uVar15] = __s[uVar15] +
                        ((int)((uint)*(byte *)((long)param + lVar9 + 0x29) * iVar7) >> 8);
          __s_00[uVar15] =
               __s_00[uVar15] + ((int)((uint)*(byte *)((long)param + lVar9 + 0x28) * iVar7) >> 8);
          uVar15 = uVar15 + 1;
        } while (uVar8 != uVar15);
      }
    }
  }
  goto LAB_00166c87;
LAB_00166e51:
  *(undefined1 *)(puVar1 + 8) = 0;
LAB_00166c87:
  lVar5 = lVar5 + 1;
  if (lVar5 == 0x18) {
    return;
  }
  goto LAB_00166c68;
}

Assistant:

static void c140_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c140_state *info = (c140_state *)param;
	UINT32  i,j;

	INT32   dt;
	INT32   sz;

	UINT8   *pSampleData;
	INT32   frequency,delta;
	UINT32  cnt;

	DEV_SMPL *lmix, *rmix;

	/* Set mixer outputs base pointers */
	lmix = outputs[0];
	rmix = outputs[1];

	/* zap the contents of the mixer buffer */
	memset(lmix, 0, samples * sizeof(DEV_SMPL));
	memset(rmix, 0, samples * sizeof(DEV_SMPL));
	if (info->pRom == NULL)
		return;

	//--- audio update
	for( i=0;i<MAX_VOICE;i++ )
	{
		C140_VOICE *v = &info->voi[i];
		const struct voice_registers *vreg = (struct voice_registers *)&info->REG[i*16];

		if( v->key && ! v->Muted)
		{
			frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;

			/* Abort voice if no frequency value set */
			if(frequency==0) continue;

			/* Delta =  frequency * ((8MHz/374)*2 / sample rate) */
			delta=(INT32)((float)frequency * info->pbase);

			/* calculate sample size */
			sz=v->sample_end-v->sample_start;

			/* Retrieve base pointer to the sample data */
			pSampleData = info->pRom + find_sample(info, v->sample_start, vreg->bank, i);

			/* Switch on data type - compressed PCM is only for C140 */
			if (vreg->mode&C140_MODE_MULAW)
			{
				//compressed PCM (maybe correct...)
				/* Loop for enough to fill sample buffer as requested */
				for(j=0;j<samples;j++)
				{
					v->ptoffset += delta;
					cnt = (v->ptoffset>>16)&0x7fff;
					v->ptoffset &= 0xffff;
					v->pos+=cnt;
					//for(;cnt>0;cnt--)
					{
						/* Check for the end of the sample */
						if(v->pos >= sz)
						{
							/* Check if its a looping sample, either stop or loop */
							if(vreg->mode&C140_MODE_LOOP)
							{
								v->pos = v->sample_loop - v->sample_start;
							}
							else
							{
								v->key=0;
								break;
							}
						}

						v->prevdt=v->lastdt;
						v->lastdt=info->mulaw_table[pSampleData[v->pos]];
						v->dltdt=(v->lastdt - v->prevdt);
					}

					/* Caclulate the sample value */
					dt=((v->dltdt*v->ptoffset)>>16)+v->prevdt;

					/* Write the data to the sample buffers */
					lmix[j]+=(dt*vreg->volume_left)>>8;
					rmix[j]+=(dt*vreg->volume_right)>>8;
				}
			}
			else
			{
				/* linear 8bit signed PCM */
				for(j=0;j<samples;j++)
				{
					v->ptoffset += delta;
					cnt = (v->ptoffset>>16)&0x7fff;
					v->ptoffset &= 0xffff;
					v->pos += cnt;
					/* Check for the end of the sample */
					if(v->pos >= sz)
					{
						/* Check if its a looping sample, either stop or loop */
						if( vreg->mode&C140_MODE_LOOP )
						{
							v->pos = v->sample_loop - v->sample_start;
						}
						else
						{
							v->key=0;
							break;
						}
					}

					if( cnt )
					{
						v->prevdt=v->lastdt;
						v->lastdt=(INT8)pSampleData[v->pos]<<8;
						v->dltdt = (v->lastdt - v->prevdt);
					}

					/* Caclulate the sample value */
					dt=((v->dltdt*v->ptoffset)>>16)+v->prevdt;

					/* Write the data to the sample buffers */
					lmix[j]+=(dt*vreg->volume_left)>>8;
					rmix[j]+=(dt*vreg->volume_right)>>8;
				}
			}
		}
	}
}